

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::RunContext::assertionEnded(RunContext *this,AssertionResult *result)

{
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages;
  SourceLineInfo *_lineInfo;
  long *plVar1;
  OfType OVar2;
  IStreamingReporter *pIVar3;
  int iVar4;
  long lVar5;
  string local_178;
  string local_158;
  undefined1 local_138 [48];
  undefined1 local_108 [24];
  _Alloc_hider local_f0;
  char local_e0 [104];
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> local_78 [3];
  
  OVar2 = (result->m_resultData).resultType;
  if (OVar2 == Ok) {
    lVar5 = 0x110;
  }
  else if (((OVar2 & FailureBit) == Ok) ||
          (lVar5 = 0x118, ((result->m_info).resultDisposition & SuppressFail) != 0))
  goto LAB_0013974f;
  plVar1 = (long *)((long)&(this->super_IResultCapture)._vptr_IResultCapture + lVar5);
  *plVar1 = *plVar1 + 1;
LAB_0013974f:
  pIVar3 = (this->m_reporter).m_p;
  _infoMessages = &this->m_messages;
  AssertionStats::AssertionStats((AssertionStats *)local_138,result,_infoMessages,&this->m_totals);
  iVar4 = (*(pIVar3->super_IShared).super_NonCopyable._vptr_NonCopyable[0xb])
                    (pIVar3,(AssertionStats *)local_138);
  local_138._0_8_ = &PTR__AssertionStats_00166cf0;
  std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::~vector(local_78);
  AssertionResult::~AssertionResult((AssertionResult *)(local_138 + 8));
  if ((char)iVar4 != '\0') {
    std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::_M_erase_at_end
              (_infoMessages,
               (_infoMessages->
               super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>)._M_impl.
               super__Vector_impl_data._M_start);
  }
  local_158._M_dataplus._M_p = (pointer)&local_158.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"");
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_178,"{Unknown expression after the reported line}","");
  _lineInfo = &(this->m_lastAssertionInfo).lineInfo;
  AssertionInfo::AssertionInfo
            ((AssertionInfo *)local_138,&local_158,_lineInfo,&local_178,
             (this->m_lastAssertionInfo).resultDisposition);
  std::__cxx11::string::operator=((string *)&this->m_lastAssertionInfo,(string *)local_138);
  std::__cxx11::string::operator=((string *)_lineInfo,(string *)(local_138 + 0x20));
  (this->m_lastAssertionInfo).lineInfo.line = local_108._16_8_;
  std::__cxx11::string::operator=
            ((string *)&(this->m_lastAssertionInfo).capturedExpression,(string *)&local_f0);
  (this->m_lastAssertionInfo).resultDisposition = local_e0._16_4_;
  if (local_f0._M_p != local_e0) {
    operator_delete(local_f0._M_p);
  }
  if ((undefined1 *)local_138._32_8_ != local_108) {
    operator_delete((void *)local_138._32_8_);
  }
  if ((undefined1 *)local_138._0_8_ != local_138 + 0x10) {
    operator_delete((void *)local_138._0_8_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_158._M_dataplus._M_p != &local_158.field_2) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  AssertionResult::operator=(&this->m_lastResult,result);
  return;
}

Assistant:

virtual void assertionEnded( AssertionResult const& result ) {
            if( result.getResultType() == ResultWas::Ok ) {
                m_totals.assertions.passed++;
            }
            else if( !result.isOk() ) {
                m_totals.assertions.failed++;
            }

            if( m_reporter->assertionEnded( AssertionStats( result, m_messages, m_totals ) ) )
                m_messages.clear();

            // Reset working state
            m_lastAssertionInfo = AssertionInfo( "", m_lastAssertionInfo.lineInfo, "{Unknown expression after the reported line}" , m_lastAssertionInfo.resultDisposition );
            m_lastResult = result;
        }